

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O3

void * liblogger::LogUnixServer::Run(void *arg)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  socklen_t addr_len;
  pollfd fds [2];
  sockaddr_un addr;
  socklen_t local_bc;
  pollfd local_b8;
  undefined4 local_b0;
  uint local_ac;
  sockaddr local_9e [6];
  
  do {
    local_b8.fd = *(int *)((long)arg + 0x70);
    local_b8.events = 1;
    local_b8.revents = 0;
    local_b0 = *(undefined4 *)((long)arg + 0x74);
    local_ac = 1;
    iVar1 = poll(&local_b8,2,0);
    if (iVar1 < 0) goto LAB_001367b5;
    if ((local_b8._4_4_ & 0x10000) != 0) {
      local_bc = 0x6e;
      iVar1 = accept(*(int *)((long)arg + 0x70),local_9e,&local_bc);
      if (-1 < iVar1) {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)arg + 0x10));
        if (iVar2 != 0) {
LAB_001367b5:
          abort();
        }
        p_Var3 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var3[1]._M_next = iVar1;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        *(long *)((long)arg + 0x48) = *(long *)((long)arg + 0x48) + 1;
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)((long)arg + 0x10));
        if (iVar1 != 0) goto LAB_001367b5;
      }
    }
    if ((local_ac & 0x10000) != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *LogUnixServer::Run(void *arg)
{
	LogUnixServer *self = (LogUnixServer *) arg;

	bool busy = true;
	while(busy)
	{
		struct pollfd fds[2];

		fds[0].fd = self->m_acceptfd;
		fds[0].events = POLLIN;
		fds[0].revents = 0;

		fds[1].fd = self->m_ctlfd[0];
		fds[1].events = POLLIN;
		fds[1].revents = 0;

		int ret = poll(fds, 2, 0);
		if (ret < 0)
		{
			switch(errno)
			{
				default:
					abort();
			}
		}

		if ( (fds[0].revents & POLLIN) ) {
			//Accept
			struct sockaddr_un addr;
			socklen_t addr_len = sizeof(addr);
			int nclient = accept(self->m_acceptfd, (struct sockaddr *) &addr, &addr_len);
			if (nclient >= 0)
			{
				self->Lock();
				self->m_list.push_back(nclient);
				self->Unlock();
			}
		}

		//Check eventfd and exit if it has data
		if ( (fds[1].revents & POLLIN) ) {
			busy = false;
		}

	}

	return NULL;
}